

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O3

void __thiscall PhPacker_Arg_L_Test::~PhPacker_Arg_L_Test(PhPacker_Arg_L_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(PhPacker, Arg_L)
{
   std::string str = PhPacker::pack<uint32_t>('L', 655351234);
   size_t result = std::any_cast<uint32_t>(PhPacker::unpack('L', str));
   size_t expected = 655351234;
   GTEST_ASSERT_EQ(result, expected);

   str = PhPacker::pack<uint32_t>('L', 65);
   result = std::any_cast<uint32_t>(PhPacker::unpack('L', str));
   expected = 65;
   GTEST_ASSERT_EQ(result, expected);

   str = PhPacker::pack<uint32_t>('L', std::numeric_limits<uint32_t>::max());
   result = std::any_cast<uint32_t>(PhPacker::unpack('L', str));
   expected = std::numeric_limits<uint32_t>::max();
   GTEST_ASSERT_EQ(result, expected);


   str = PhPacker::pack<uint32_t>('L', std::numeric_limits<uint32_t>::min());
   result = std::any_cast<uint32_t>(PhPacker::unpack('L', str));
   expected = std::numeric_limits<uint32_t>::min();
   GTEST_ASSERT_EQ(result, expected);
}